

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadSemaphorePosix.cpp
# Opt level: O2

void __thiscall IlmThread_3_2::Semaphore::post(Semaphore *this)

{
  int iVar1;
  allocator<char> local_29;
  string local_28 [32];
  
  iVar1 = sem_post((sem_t *)&this->_semaphore);
  if (iVar1 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              (local_28,"Post operation on semaphore failed (%T).",&local_29);
    Iex_3_2::throwErrnoExc(local_28);
    std::__cxx11::string::~string(local_28);
  }
  return;
}

Assistant:

void
Semaphore::post ()
{
    if (::sem_post (&_semaphore))
        IEX_NAMESPACE::throwErrnoExc (
            "Post operation on semaphore failed (%T).");
}